

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_unused_var_Test::TestBody(pass_unused_var_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Port *pPVar3;
  Var *pVVar4;
  char *pcVar5;
  char *in_R9;
  string local_470;
  AssertHelper local_450;
  Message local_448;
  allocator<char> local_439;
  string local_438 [32];
  undefined1 local_418 [23];
  bool local_401;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3d0;
  Message local_3c8;
  allocator<char> local_3b9;
  string local_3b8 [32];
  undefined1 local_398 [24];
  undefined1 local_380 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_350;
  Message local_348;
  allocator<char> local_339;
  string local_338 [32];
  undefined1 local_318 [24];
  undefined1 local_300 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2d0;
  Message local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [24];
  undefined1 local_280 [8];
  AssertionResult gtest_ar_;
  shared_ptr<kratos::Stmt> local_260;
  undefined1 local_250 [39];
  allocator<char> local_229;
  string local_228;
  undefined8 local_208;
  Var *var2;
  string local_1f8;
  Var *local_1d8;
  Var *var1;
  string local_1c8;
  __node_base local_1a8;
  Port *port2;
  string local_198;
  __node_base local_178;
  Port *port1;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context c;
  pass_unused_var_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"in",(allocator<char> *)((long)&port2 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,In,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&port2 + 7));
  pGVar2 = local_138;
  local_178._M_nxt = (_Hash_node_base *)pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"out",(allocator<char> *)((long)&var1 + 7));
  pPVar3 = kratos::Generator::port(pGVar2,Out,&local_1c8,1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&var1 + 7));
  pGVar2 = local_138;
  local_1a8._M_nxt = (_Hash_node_base *)pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"c",(allocator<char> *)((long)&var2 + 7));
  pVVar4 = kratos::Generator::var(pGVar2,&local_1f8,1);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&var2 + 7));
  pGVar2 = local_138;
  local_1d8 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"d",&local_229);
  pVVar4 = kratos::Generator::var(pGVar2,&local_228,1);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  pGVar2 = local_138;
  local_208 = pVVar4;
  kratos::Var::assign((Var *)local_250,local_1d8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_250 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_250);
  kratos::Generator::add_stmt(pGVar2,(shared_ptr<kratos::Stmt> *)(local_250 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_250 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_250);
  pGVar2 = local_138;
  kratos::Var::assign((Var *)&gtest_ar_.message_,(Var *)local_1a8._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_260,(shared_ptr<kratos::AssignStmt> *)&gtest_ar_.message_);
  kratos::Generator::add_stmt(pGVar2,&local_260);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_260);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&gtest_ar_.message_);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"d",&local_2b9);
  kratos::Generator::get_var((Generator *)local_298,(string *)pGVar2);
  local_298[0x17] = std::operator!=((shared_ptr<kratos::Var> *)local_298,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,(bool *)(local_298 + 0x17),(type *)0x0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_280,
               (AssertionResult *)"mod.get_var(\"d\") != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,400,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  kratos::remove_unused_vars(local_138);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"d",&local_339);
  kratos::Generator::get_var((Generator *)local_318,(string *)pGVar2);
  local_318[0x17] = std::operator==((shared_ptr<kratos::Var> *)local_318,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,(bool *)(local_318 + 0x17),(type *)0x0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_318);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_300,
               (AssertionResult *)"mod.get_var(\"d\") == nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x193,pcVar5);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"in",&local_3b9);
  kratos::Generator::get_var((Generator *)local_398,(string *)pGVar2);
  local_398[0x17] = std::operator!=((shared_ptr<kratos::Var> *)local_398,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_380,(bool *)(local_398 + 0x17),(type *)0x0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_398);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_380,
               (AssertionResult *)"mod.get_var(\"in\") != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x194,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"c",&local_439);
  kratos::Generator::get_var((Generator *)local_418,(string *)pGVar2);
  local_401 = std::operator!=((shared_ptr<kratos::Var> *)local_418,(nullptr_t)0x0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_400,&local_401,(type *)0x0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_418);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_470,(internal *)local_400,(AssertionResult *)"mod.get_var(\"c\") != nullptr",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x195,pcVar5);
    testing::internal::AssertHelper::operator=(&local_450,&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, unused_var) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &port1 = mod.port(PortDirection::In, "in", 1);
    auto &port2 = mod.port(PortDirection::Out, "out", 1);
    auto &var1 = mod.var("c", 1);
    auto &var2 = mod.var("d", 1);
    mod.add_stmt(var1.assign(port1));
    mod.add_stmt(port2.assign(var1));
    // var2 is unused
    (void)var2;

    EXPECT_TRUE(mod.get_var("d") != nullptr);
    remove_unused_vars(&mod);

    EXPECT_TRUE(mod.get_var("d") == nullptr);
    EXPECT_TRUE(mod.get_var("in") != nullptr);
    EXPECT_TRUE(mod.get_var("c") != nullptr);
}